

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsEvaluation
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          double *costValue)

{
  OptimalControlProblemPimpl *pOVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  _Rb_tree_node_base *p_Var5;
  string *psVar6;
  ostream *poVar7;
  double addCost;
  ostringstream errorMsg;
  double local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  *costValue = 0.0;
  pOVar1 = this->m_pimpl;
  p_Var5 = (pOVar1->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    bVar2 = (_Rb_tree_header *)p_Var5 == &(pOVar1->costs)._M_t._M_impl.super__Rb_tree_header;
    if (bVar2) {
      return bVar2;
    }
    bVar3 = TimeRange::isInRange((TimeRange *)&p_Var5[8]._M_left,time);
    if (bVar3) {
      cVar4 = (**(code **)(**(long **)(p_Var5 + 2) + 0x10))
                        (time,*(long **)(p_Var5 + 2),state,control,&local_1d0);
      if (cVar4 == '\0') {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error while evaluating cost ",0x1c);
        psVar6 = Cost::name_abi_cxx11_(*(Cost **)(p_Var5 + 2));
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("OptimalControlProblem","costsEvaluation",(char *)local_1c8);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        return bVar2;
      }
      *costValue = (double)p_Var5[8]._M_parent * local_1d0 + *costValue;
    }
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

bool OptimalControlProblem::costsEvaluation(double time, const VectorDynSize &state, const VectorDynSize &control, double &costValue)
        {
            costValue = 0;
            double addCost;
            for(auto& cost : m_pimpl->costs){
                if (cost.second.timeRange.isInRange(time)){
                    if(!cost.second.cost->costEvaluation(time, state, control, addCost)){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating cost " << cost.second.cost->name() <<".";
                        reportError("OptimalControlProblem", "costsEvaluation", errorMsg.str().c_str());
                        return false;
                    }
                    costValue += cost.second.weight*addCost;
                }
            }

            return true;
        }